

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

Bucket __thiscall
QHashPrivate::
Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>::
findBucketWithHash<QTextureGlyphCache::GlyphAndSubPixelPosition>
          (Data<QHashPrivate::Node<QTextureGlyphCache::GlyphAndSubPixelPosition,_QTextureGlyphCache::Coord>_>
           *this,GlyphAndSubPixelPosition *key,size_t hash)

{
  Entry *pEVar1;
  undefined8 uVar2;
  Span *pSVar3;
  Span *pSVar4;
  Span *pSVar5;
  ulong uVar6;
  byte bVar7;
  int iVar9;
  undefined1 auVar8 [16];
  Bucket BVar10;
  
  pSVar3 = this->spans;
  uVar6 = this->numBuckets - 1 & hash;
  pSVar4 = pSVar3 + (uVar6 >> 7);
  uVar6 = (ulong)((uint)uVar6 & 0x7f);
  bVar7 = pSVar4->offsets[uVar6];
  if (bVar7 != 0xff) {
    do {
      if ((*(glyph_t *)pSVar4->entries[bVar7].storage.data == key->glyph) &&
         (pEVar1 = pSVar4->entries + bVar7, uVar2 = *(undefined8 *)((pEVar1->storage).data + 4),
         auVar8._0_4_ = -(uint)((int)uVar2 == (key->subPixelPosition).x.val),
         iVar9 = -(uint)((int)((ulong)uVar2 >> 0x20) == (key->subPixelPosition).y.val),
         auVar8._4_4_ = auVar8._0_4_, auVar8._8_4_ = iVar9, auVar8._12_4_ = iVar9,
         iVar9 = movmskpd((int)pEVar1,auVar8), iVar9 == 3)) break;
      uVar6 = uVar6 + 1;
      if (uVar6 == 0x80) {
        pSVar5 = pSVar4 + 1;
        pSVar4 = pSVar3;
        if (((long)pSVar5 - (long)pSVar3 >> 4) * -0x71c71c71c71c71c7 - (this->numBuckets >> 7) != 0)
        {
          pSVar4 = pSVar5;
        }
        uVar6 = 0;
      }
      bVar7 = pSVar4->offsets[uVar6];
    } while (bVar7 != 0xff);
  }
  BVar10.index = uVar6;
  BVar10.span = pSVar4;
  return BVar10;
}

Assistant:

Bucket findBucketWithHash(const K &key, size_t hash) const noexcept
    {
        static_assert(std::is_same_v<std::remove_cv_t<Key>, K> ||
                QHashHeterogeneousSearch<std::remove_cv_t<Key>, K>::value);
        Q_ASSERT(numBuckets > 0);
        Bucket bucket(this, GrowthPolicy::bucketForHash(numBuckets, hash));
        // loop over the buckets until we find the entry we search for
        // or an empty slot, in which case we know the entry doesn't exist
        while (true) {
            size_t offset = bucket.offset();
            if (offset == SpanConstants::UnusedEntry) {
                return bucket;
            } else {
                Node &n = bucket.nodeAtOffset(offset);
                if (qHashEquals(n.key, key))
                    return bucket;
            }
            bucket.advanceWrapped(this);
        }
    }